

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UBool __thiscall icu_63::UnicodeSet::operator==(UnicodeSet *this,UnicodeSet *o)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  UBool UVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = this->len;
  uVar5 = 0;
  if (uVar3 == o->len) {
    uVar6 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar6 = uVar5;
    }
    do {
      if (uVar6 == uVar5) {
        UVar4 = UVector::operator!=(this->strings,o->strings);
        uVar5 = (ulong)(UVar4 == '\0');
        goto LAB_002a746a;
      }
      piVar1 = this->list + uVar5;
      piVar2 = o->list + uVar5;
      uVar5 = uVar5 + 1;
    } while (*piVar1 == *piVar2);
    uVar5 = 0;
  }
LAB_002a746a:
  return (UBool)uVar5;
}

Assistant:

UBool UnicodeSet::operator==(const UnicodeSet& o) const {
    if (len != o.len) return FALSE;
    for (int32_t i = 0; i < len; ++i) {
        if (list[i] != o.list[i]) return FALSE;
    }
    if (*strings != *o.strings) return FALSE;
    return TRUE;
}